

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::BitAggState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::BitStringAggOperation>
               (hugeint_t *idata,AggregateInputData *aggr_input_data,
               BitAggState<duckdb::hugeint_t> **states,ValidityMask *mask,idx_t count)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  AggregateUnaryInput *pAVar4;
  unsigned_long uVar5;
  ulong uVar6;
  ulong uVar7;
  hugeint_t local_60;
  ulong local_50;
  ulong local_48;
  AggregateUnaryInput *local_40;
  ulong local_38;
  
  local_60.lower = (uint64_t)aggr_input_data;
  local_60.upper = (int64_t)mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    local_50 = 0;
    if (count != 0) {
      do {
        BitStringAggOperation::
        Operation<duckdb::hugeint_t,duckdb::BitAggState<duckdb::hugeint_t>,duckdb::BitStringAggOperation>
                  ((BitStringAggOperation *)states[local_50],
                   (BitAggState<duckdb::hugeint_t> *)(idata + local_50),&local_60,
                   (AggregateUnaryInput *)mask);
        local_50 = local_50 + 1;
      } while (local_50 < count);
    }
  }
  else {
    local_50 = 0;
    if (0x3f < count + 0x3f) {
      local_48 = count + 0x3f >> 6;
      uVar6 = 0;
      local_40 = (AggregateUnaryInput *)mask;
      local_38 = count;
      do {
        uVar2 = local_50;
        puVar1 = ((TemplatedValidityMask<unsigned_long> *)&local_40->input)->validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar5 = 0xffffffffffffffff;
        }
        else {
          uVar5 = puVar1[uVar6];
        }
        uVar7 = local_50 + 0x40;
        if (local_38 <= local_50 + 0x40) {
          uVar7 = local_38;
        }
        uVar3 = uVar7;
        if (uVar5 != 0) {
          pAVar4 = local_40;
          if (uVar5 == 0xffffffffffffffff) {
            for (; uVar3 = local_50, local_50 < uVar7; local_50 = local_50 + 1) {
              BitStringAggOperation::
              Operation<duckdb::hugeint_t,duckdb::BitAggState<duckdb::hugeint_t>,duckdb::BitStringAggOperation>
                        ((BitStringAggOperation *)states[local_50],
                         (BitAggState<duckdb::hugeint_t> *)(idata + local_50),&local_60,pAVar4);
            }
          }
          else {
            for (; uVar3 = local_50, local_50 < uVar7; local_50 = local_50 + 1) {
              if ((uVar5 >> ((ulong)(uint)((int)local_50 - (int)uVar2) & 0x3f) & 1) != 0) {
                BitStringAggOperation::
                Operation<duckdb::hugeint_t,duckdb::BitAggState<duckdb::hugeint_t>,duckdb::BitStringAggOperation>
                          ((BitStringAggOperation *)states[local_50],
                           (BitAggState<duckdb::hugeint_t> *)(idata + local_50),&local_60,pAVar4);
              }
            }
          }
        }
        local_50 = uVar3;
        uVar6 = uVar6 + 1;
      } while (uVar6 != local_48);
    }
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}